

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_opt.c
# Opt level: O2

MPP_RET mpp_opt_setup(MppOpt opt,void *ctx)

{
  MPP_RET MVar1;
  
  MVar1 = MPP_NOK;
  if (opt != (MppOpt)0x0) {
    mpp_trie_init((long)opt + 8,"mpp_opt");
    if (*(long *)((long)opt + 8) != 0) {
      *(void **)opt = ctx;
      MVar1 = MPP_OK;
    }
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_opt_setup(MppOpt opt, void *ctx)
{
    MppOptImpl *impl = (MppOptImpl *)opt;

    if (NULL == impl)
        return MPP_NOK;

    mpp_trie_init(&impl->trie, "mpp_opt");
    if (impl->trie) {
        impl->ctx = ctx;
        return MPP_OK;
    }

    return MPP_NOK;
}